

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::checkForCustomUnit(string *unit_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  _Alloc_hider _Var5;
  ushort uVar6;
  int iVar7;
  uint32_t uVar8;
  unit_data uVar9;
  long lVar10;
  ulong uVar11;
  size_type sVar12;
  bool bVar13;
  precise_unit pVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> csub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  double local_50;
  string local_48;
  
  uVar11 = 0xfa94a488;
  pcVar3 = (unit_string->_M_dataplus)._M_p;
  local_50 = NAN;
  if (*pcVar3 == '{') {
    if (pcVar3[unit_string->_M_string_length - 1] != '}') goto LAB_003f912a;
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'u}","");
    uVar4 = unit_string->_M_string_length;
    sVar12 = uVar4 - local_70._M_string_length;
    if (uVar4 < local_70._M_string_length || sVar12 == 0) {
      bVar13 = false;
    }
    else {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(unit_string,sVar12,local_70._M_string_length,&local_70);
      bVar13 = iVar7 == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar13) {
      lVar10 = -3;
      goto LAB_003f8f7c;
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"index}","");
    uVar4 = unit_string->_M_string_length;
    sVar12 = uVar4 - local_70._M_string_length;
    if (local_70._M_string_length <= uVar4 && sVar12 != 0) {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(unit_string,sVar12,local_70._M_string_length,&local_70);
      goto LAB_003f8fef;
    }
LAB_003f8ff7:
    bVar13 = false;
LAB_003f8ff9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (!bVar13) goto LAB_003f912a;
    bVar13 = true;
    lVar10 = -6;
  }
  else {
    if ((*pcVar3 != '[') || (pcVar3[unit_string->_M_string_length - 1] != ']')) goto LAB_003f912a;
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"U]","");
    uVar4 = unit_string->_M_string_length;
    sVar12 = uVar4 - local_70._M_string_length;
    if (uVar4 < local_70._M_string_length || sVar12 == 0) {
      bVar13 = false;
    }
    else {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(unit_string,sVar12,local_70._M_string_length,&local_70);
      bVar13 = iVar7 == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (!bVar13) {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"index]","");
      uVar4 = unit_string->_M_string_length;
      sVar12 = uVar4 - local_70._M_string_length;
      if (uVar4 < local_70._M_string_length || sVar12 == 0) goto LAB_003f8ff7;
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(unit_string,sVar12,local_70._M_string_length,&local_70);
LAB_003f8fef:
      bVar13 = iVar7 == 0;
      goto LAB_003f8ff9;
    }
    lVar10 = -2;
LAB_003f8f7c:
    bVar13 = false;
  }
  lVar10 = lVar10 + unit_string->_M_string_length;
  if (lVar10 != -1) {
    cVar2 = (unit_string->_M_dataplus)._M_p[lVar10 + -1];
    if ((cVar2 == '_') || (cVar2 == '\'')) {
      sVar12 = lVar10 - 2;
    }
    else {
      sVar12 = lVar10 - 1;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,1,
               sVar12);
    sVar12 = local_70._M_string_length;
    _Var5._M_p = local_70._M_dataplus._M_p;
    if (bVar13) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      uVar8 = getCommodity(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (ulong)uVar8 << 0x20 | 0x51800;
    }
    else {
      if (local_70._M_string_length == 0) {
        local_70._M_string_length = 0;
      }
      else {
        uVar11 = 0;
        do {
          iVar7 = tolower((int)_Var5._M_p[uVar11]);
          _Var5._M_p[uVar11] = (char)iVar7;
          uVar11 = uVar11 + 1;
        } while (sVar12 != uVar11);
      }
      uVar6 = std::_Hash_bytes(local_70._M_dataplus._M_p,local_70._M_string_length,0xc70f6907);
      uVar9 = precise::custom::custom_unit(uVar6 & 0x3f);
      uVar11 = (ulong)(uint)uVar9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_50 = 1.0;
  }
LAB_003f912a:
  pVar14.base_units_ = (unit_data)(int)uVar11;
  pVar14.commodity_ = (int)(uVar11 >> 0x20);
  pVar14.multiplier_ = local_50;
  return pVar14;
}

Assistant:

static precise_unit checkForCustomUnit(const std::string& unit_string)
{
    size_t loc = std::string::npos;
    bool index = false;
    if (unit_string.front() == '[' && unit_string.back() == ']') {
        if (ends_with(unit_string, "U]")) {
            loc = unit_string.size() - 2;
        } else if (ends_with(unit_string, "index]")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    } else if (unit_string.front() == '{' && unit_string.back() == '}') {
        if (ends_with(unit_string, "'u}")) {
            loc = unit_string.size() - 3;
        } else if (ends_with(unit_string, "index}")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    }
    if (loc != std::string::npos) {
        if ((unit_string[loc - 1] == '\'') || (unit_string[loc - 1] == '_')) {
            --loc;
        }
        auto csub = unit_string.substr(1, loc - 1);

        if (index) {
            auto hcode = getCommodity(csub);
            return {1.0, precise::generate_custom_count_unit(0), hcode};
        }

        std::transform(csub.begin(), csub.end(), csub.begin(), ::tolower);
        auto custcode = std::hash<std::string>{}(csub);
        return precise::generate_custom_unit(custcode & 0x3FU);
    }

    return precise::invalid;
}